

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFile_p.cpp
# Opt level: O1

bool __thiscall BamTools::Internal::BamFile::Open(BamFile *this,OpenMode mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  FILE *pFVar4;
  long *plVar5;
  size_type *psVar6;
  string message;
  string message_base;
  string local_80;
  string local_60;
  string local_40;
  
  (*(this->super_ILocalIODevice).super_IBamIODevice._vptr_IBamIODevice[2])();
  if (mode - ReadOnly < 3) {
    pFVar4 = fopen64((this->m_filename)._M_dataplus._M_p,
                     &DAT_001c890c + *(int *)(&DAT_001c890c + (ulong)(mode - ReadOnly) * 4));
    (this->super_ILocalIODevice).m_stream = (FILE *)pFVar4;
    if (pFVar4 != (FILE *)0x0) {
      (this->super_ILocalIODevice).super_IBamIODevice.m_mode = mode;
      return true;
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"could not open file handle for ","");
    sVar2 = (this->m_filename)._M_string_length;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    if (sVar2 == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"empty filename","");
    }
    else {
      pcVar3 = (this->m_filename)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar3,pcVar3 + sVar2);
    }
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_60,0,(char *)0x0,(ulong)local_40._M_dataplus._M_p);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_80.field_2._M_allocated_capacity = *psVar6;
      local_80.field_2._8_8_ = plVar5[3];
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar6;
      local_80._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_80._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    paVar1 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"BamFile::Open","");
    IBamIODevice::SetErrorString((IBamIODevice *)this,&local_60,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"BamFile::Open","");
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"unknown open mode requested","");
    IBamIODevice::SetErrorString((IBamIODevice *)this,&local_40,&local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool BamFile::Open(const IBamIODevice::OpenMode mode)
{

    // make sure we're starting with a fresh file stream
    Close();

    // attempt to open FILE* depending on requested openmode
    if (mode == IBamIODevice::ReadOnly)
        m_stream = fopen(m_filename.c_str(), "rb");
    else if (mode == IBamIODevice::WriteOnly)
        m_stream = fopen(m_filename.c_str(), "wb");
    else if (mode == IBamIODevice::ReadWrite)
        m_stream = fopen(m_filename.c_str(), "w+b");
    else {
        SetErrorString("BamFile::Open", "unknown open mode requested");
        return false;
    }

    // check that we obtained a valid FILE*
    if (m_stream == 0) {
        const std::string message_base = std::string("could not open file handle for ");
        const std::string message =
            message_base + ((m_filename.empty()) ? "empty filename" : m_filename);
        SetErrorString("BamFile::Open", message);
        return false;
    }

    // store current IO mode & return success
    m_mode = mode;
    return true;
}